

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatcc_builder_union_vec_ref_t
flatcc_builder_create_union_vector_direct
          (flatcc_builder_t *B,flatcc_builder_utype_t *types,flatcc_builder_ref_t *data,size_t count
          )

{
  flatcc_builder_union_vec_ref_t fVar1;
  size_t count_local;
  flatcc_builder_ref_t *data_local;
  flatcc_builder_utype_t *types_local;
  flatcc_builder_t *B_local;
  flatcc_builder_union_vec_ref_t uvref;
  
  memset(&B_local,0,8);
  B_local._4_4_ = _create_offset_vector_direct(B,data,count,types);
  if (B_local._4_4_ != 0) {
    B_local._0_4_ = flatcc_builder_create_type_vector(B,types,count);
  }
  fVar1.value = B_local._4_4_;
  fVar1.type = (flatcc_builder_ref_t)B_local;
  return fVar1;
}

Assistant:

flatcc_builder_union_vec_ref_t flatcc_builder_create_union_vector_direct(flatcc_builder_t *B,
        const flatcc_builder_utype_t *types, flatcc_builder_ref_t *data, size_t count)
{
    flatcc_builder_union_vec_ref_t uvref = { 0, 0 };

    if (0 == (uvref.value = _create_offset_vector_direct(B, data, count, types))) {
        return uvref;
    }
    if (0 == (uvref.type = flatcc_builder_create_type_vector(B, types, count))) {
        return uvref;
    }
    return uvref;
}